

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_flow_sl(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this,size_t node,size_t ilevel)

{
  Tree *pTVar1;
  Location LVar2;
  csubstr sp;
  csubstr tag;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  bool bVar3;
  error_flags eVar4;
  NodeData *pNVar5;
  csubstr *pcVar6;
  Callbacks *pCVar7;
  NodeScalar *pNVar8;
  size_t in_RDX;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bVar9;
  size_t count;
  size_t child;
  char msg [37];
  bool spc;
  undefined7 in_stack_fffffffffffffb28;
  char in_stack_fffffffffffffb2f;
  Tree *in_stack_fffffffffffffb30;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb38;
  Location *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  Location *in_stack_fffffffffffffb50;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb78;
  Tree *in_stack_fffffffffffffb80;
  Tree *in_stack_fffffffffffffb88;
  Tree *in_stack_fffffffffffffb90;
  pfn_error p_Var10;
  Tree *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  undefined8 in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  long local_420;
  size_t local_418;
  undefined8 local_410;
  Tree *pTStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  size_t local_3f0;
  undefined1 local_3e8 [40];
  char *local_3c0;
  size_t local_3b8;
  size_t in_stack_fffffffffffffc50;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc58;
  pfn_free local_398;
  Tree *pTStack_390;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_388;
  Location *pLStack_380;
  char *local_378;
  size_t local_370;
  Tree *pTStack_368;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_360;
  Location *pLStack_358;
  char *local_350;
  size_t local_348;
  Tree *pTStack_340;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_338;
  Location *pLStack_330;
  char *local_328;
  size_t local_320;
  Tree *pTStack_318;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_310;
  Location *pLStack_308;
  char *in_stack_fffffffffffffd00;
  undefined1 local_258 [8];
  size_t local_250;
  size_t local_248;
  undefined1 local_238 [8];
  size_t local_230;
  undefined1 local_218 [8];
  size_t local_210;
  size_t local_208;
  undefined1 local_1f8 [8];
  size_t local_1f0;
  size_t local_1e8;
  NodeData *local_1d8;
  NodeData *local_1d0;
  NodeData *local_1c8;
  Tree *local_1b8;
  Tree *local_1a8;
  Tree *local_198;
  Tree *local_188;
  Tree *local_178;
  Tree *local_168;
  NodeData *local_160;
  NodeData *local_158;
  NodeData *local_150;
  undefined8 local_148;
  Tree *pTStack_140;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  Location *pLStack_130;
  char *local_128;
  Tree *local_118;
  size_t local_110;
  Tree *local_108;
  undefined8 local_100;
  Tree *pTStack_f8;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f0;
  Location *pLStack_e8;
  char *local_e0;
  Tree *local_d0;
  size_t local_c8;
  Tree *local_c0;
  NodeData *local_b8;
  Tree *local_a8;
  Tree *local_98;
  NodeData *local_90;
  NodeData *local_88;
  NodeData *local_80;
  NodeData *local_78;
  NodeData *local_70;
  NodeData *local_68;
  NodeData *local_60;
  NodeData *local_58;
  NodeData *local_50;
  NodeData *local_48;
  void *local_40;
  undefined1 *local_38;
  void *local_30;
  undefined1 *local_28;
  void *local_20;
  undefined1 *local_18;
  void *local_10;
  undefined1 *local_8;
  
  pNVar5 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  if (((pNVar5->m_type).type & STREAM) == STREAM) {
    eVar4 = get_error_flags();
    in_stack_fffffffffffffb48 = in_stack_fffffffffffffd00;
    if (((eVar4 & 1) != 0) &&
       (bVar3 = is_debugger_attached(), in_stack_fffffffffffffb48 = in_stack_fffffffffffffd00, bVar3
       )) {
      trap_instruction();
      in_stack_fffffffffffffb48 = in_stack_fffffffffffffd00;
    }
    Location::Location(in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                       (size_t)in_stack_fffffffffffffb30,
                       CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    in_stack_fffffffffffffb28 = (undefined7)local_320;
    in_stack_fffffffffffffb2f = (char)(local_320 >> 0x38);
    loc.super_LineCol.line = (size_t)in_stack_fffffffffffffb98;
    loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffb90;
    loc.super_LineCol.col._0_7_ = in_stack_fffffffffffffba0;
    loc.super_LineCol.col._7_1_ = in_stack_fffffffffffffba7;
    loc.name.str = (char *)in_stack_fffffffffffffba8;
    loc.name.len._0_7_ = in_stack_fffffffffffffbb0;
    loc.name.len._7_1_ = in_stack_fffffffffffffbb7;
    in_stack_fffffffffffffd00 = in_stack_fffffffffffffb48;
    error<39ul>((char (*) [39])in_stack_fffffffffffffb80,loc);
    in_stack_fffffffffffffb30 = pTStack_318;
    in_stack_fffffffffffffb38 = local_310;
    in_stack_fffffffffffffb40 = pLStack_308;
  }
  local_1d8 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  if ((((local_1d8->m_type).type & (STREAM|MAP)) == NOTYPE) &&
     (local_60 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78),
     ((local_60->m_type).type & DOC) == NOTYPE)) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                       (size_t)in_stack_fffffffffffffb30,
                       CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    in_stack_fffffffffffffb28 = (undefined7)local_348;
    in_stack_fffffffffffffb2f = (char)(local_348 >> 0x38);
    loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffffb98;
    loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffffb90;
    loc_00.super_LineCol.col._0_7_ = in_stack_fffffffffffffba0;
    loc_00.super_LineCol.col._7_1_ = in_stack_fffffffffffffba7;
    loc_00.name.str = (char *)in_stack_fffffffffffffba8;
    loc_00.name.len._0_7_ = in_stack_fffffffffffffbb0;
    loc_00.name.len._7_1_ = in_stack_fffffffffffffbb7;
    error<65ul>((char (*) [65])in_stack_fffffffffffffb80,loc_00);
    in_stack_fffffffffffffb30 = pTStack_340;
    in_stack_fffffffffffffb38 = local_338;
    in_stack_fffffffffffffb40 = pLStack_330;
    in_stack_fffffffffffffb48 = local_328;
  }
  bVar3 = Tree::is_root(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  if (!bVar3) {
    pTVar1 = in_RDI->m_tree;
    local_118 = pTVar1;
    bVar3 = Tree::has_parent(in_stack_fffffffffffffb30,
                             CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    if (!bVar3) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                         (size_t)in_stack_fffffffffffffb30,
                         CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
      in_stack_fffffffffffffb28 = (undefined7)local_148;
      in_stack_fffffffffffffb2f = (char)((ulong)local_148 >> 0x38);
      loc_01.super_LineCol.line = (size_t)in_stack_fffffffffffffb98;
      loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffffb90;
      loc_01.super_LineCol.col._0_7_ = in_stack_fffffffffffffba0;
      loc_01.super_LineCol.col._7_1_ = in_stack_fffffffffffffba7;
      loc_01.name.str = (char *)in_stack_fffffffffffffba8;
      loc_01.name.len._0_7_ = in_stack_fffffffffffffbb0;
      loc_01.name.len._7_1_ = in_stack_fffffffffffffbb7;
      error<31ul>((char (*) [31])in_stack_fffffffffffffb80,loc_01);
      in_stack_fffffffffffffb30 = pTStack_140;
      in_stack_fffffffffffffb38 = local_138;
      in_stack_fffffffffffffb40 = pLStack_130;
      in_stack_fffffffffffffb48 = local_128;
    }
    pNVar5 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    local_110 = pNVar5->m_parent;
    local_108 = pTVar1;
    local_80 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    if (((local_80->m_type).type & MAP) == NOTYPE) {
      pTVar1 = in_RDI->m_tree;
      local_d0 = pTVar1;
      bVar3 = Tree::has_parent(in_stack_fffffffffffffb30,
                               CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
      if (!bVar3) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                           (size_t)in_stack_fffffffffffffb30,
                           CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        in_stack_fffffffffffffb28 = (undefined7)local_100;
        in_stack_fffffffffffffb2f = (char)((ulong)local_100 >> 0x38);
        loc_02.super_LineCol.line = (size_t)in_stack_fffffffffffffb98;
        loc_02.super_LineCol.offset = (size_t)in_stack_fffffffffffffb90;
        loc_02.super_LineCol.col._0_7_ = in_stack_fffffffffffffba0;
        loc_02.super_LineCol.col._7_1_ = in_stack_fffffffffffffba7;
        loc_02.name.str = (char *)in_stack_fffffffffffffba8;
        loc_02.name.len._0_7_ = in_stack_fffffffffffffbb0;
        loc_02.name.len._7_1_ = in_stack_fffffffffffffbb7;
        error<31ul>((char (*) [31])in_stack_fffffffffffffb80,loc_02);
        in_stack_fffffffffffffb30 = pTStack_f8;
        in_stack_fffffffffffffb38 = local_f0;
        in_stack_fffffffffffffb40 = pLStack_e8;
        in_stack_fffffffffffffb48 = local_e0;
      }
      pNVar5 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      local_c8 = pNVar5->m_parent;
      local_c0 = pTVar1;
      local_b8 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      if (((local_b8->m_type).type & SEQ) == NOTYPE) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                           (size_t)in_stack_fffffffffffffb30,
                           CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
        in_stack_fffffffffffffb28 = (undefined7)local_370;
        in_stack_fffffffffffffb2f = (char)(local_370 >> 0x38);
        loc_03.super_LineCol.line = (size_t)in_stack_fffffffffffffb98;
        loc_03.super_LineCol.offset = (size_t)in_stack_fffffffffffffb90;
        loc_03.super_LineCol.col._0_7_ = in_stack_fffffffffffffba0;
        loc_03.super_LineCol.col._7_1_ = in_stack_fffffffffffffba7;
        loc_03.name.str = (char *)in_stack_fffffffffffffba8;
        loc_03.name.len._0_7_ = in_stack_fffffffffffffbb0;
        loc_03.name.len._7_1_ = in_stack_fffffffffffffbb7;
        error<100ul>((char (*) [100])in_stack_fffffffffffffb80,loc_03);
        in_stack_fffffffffffffb30 = pTStack_368;
        in_stack_fffffffffffffb38 = local_360;
        in_stack_fffffffffffffb40 = pLStack_358;
        in_stack_fffffffffffffb48 = local_350;
      }
    }
  }
  local_58 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  if (((local_58->m_type).type & DOC) == NOTYPE) {
    local_1d0 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    if (((local_1d0->m_type).type & (STREAM|MAP)) != NOTYPE) {
      local_168 = in_RDI->m_tree;
      local_78 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      if (((local_78->m_type).type & MAP) == NOTYPE) {
        local_198 = in_RDI->m_tree;
        local_160 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
        if (((local_160->m_type).type & SEQ) == NOTYPE) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            trap_instruction();
          }
          Location::Location(in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                             (size_t)in_stack_fffffffffffffb30,
                             CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
          in_stack_fffffffffffffb28 = SUB87(local_398,0);
          in_stack_fffffffffffffb2f = (char)((ulong)local_398 >> 0x38);
          loc_04.super_LineCol.line = (size_t)in_stack_fffffffffffffb98;
          loc_04.super_LineCol.offset = (size_t)in_stack_fffffffffffffb90;
          loc_04.super_LineCol.col._0_7_ = in_stack_fffffffffffffba0;
          loc_04.super_LineCol.col._7_1_ = in_stack_fffffffffffffba7;
          loc_04.name.str = (char *)in_stack_fffffffffffffba8;
          loc_04.name.len._0_7_ = in_stack_fffffffffffffbb0;
          loc_04.name.len._7_1_ = in_stack_fffffffffffffbb7;
          error<59ul>((char (*) [59])in_stack_fffffffffffffb80,loc_04);
          in_stack_fffffffffffffb30 = pTStack_390;
          in_stack_fffffffffffffb38 = local_388;
          in_stack_fffffffffffffb40 = pLStack_380;
          in_stack_fffffffffffffb48 = local_378;
        }
      }
      local_1c8 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      bVar3 = ((local_1c8->m_type).type & KEY) != NOTYPE;
      if (bVar3) {
        local_230 = in_RDX;
        pNVar8 = Tree::keysc(in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
        pNVar5 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
        local_20 = (void *)((pNVar5->m_type).type & (_WIP_KEY_STYLE|KEYQUO|KEYANCH|KEYREF|KEY));
        local_18 = local_238;
        _write(in_RDI,(int)pNVar8,local_20,local_230);
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
      }
      local_a8 = in_RDI->m_tree;
      local_90 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      bVar9 = false;
      if (((local_90->m_type).type & VALTAG) != NOTYPE) {
        bVar9 = ((local_90->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
      }
      if (bVar9) {
        if (bVar3) {
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
        }
        Tree::val_tag(in_stack_fffffffffffffb98,(size_t)in_stack_fffffffffffffb90);
        tag.len = (size_t)in_stack_fffffffffffffb50;
        tag.str = in_stack_fffffffffffffb48;
        _write_tag((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb40,tag);
        bVar3 = true;
      }
      local_98 = in_RDI->m_tree;
      local_88 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      bVar9 = false;
      if (((local_88->m_type).type & VALANCH) != NOTYPE) {
        bVar9 = ((local_88->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
      }
      if (bVar9) {
        if (bVar3) {
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
        }
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
        pcVar6 = Tree::val_anchor(in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
        local_3c0 = pcVar6->str;
        local_3b8 = pcVar6->len;
        sp.len = (size_t)in_stack_fffffffffffffb48;
        sp.str = (char *)in_stack_fffffffffffffb40;
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffb38,sp);
        bVar3 = true;
      }
      if (bVar3) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
      }
      local_178 = in_RDI->m_tree;
      local_70 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      if (((local_70->m_type).type & MAP) == NOTYPE) {
        local_1a8 = in_RDI->m_tree;
        local_158 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
        if (((local_158->m_type).type & SEQ) == NOTYPE) {
          memcpy(local_3e8,"check failed: (m_tree->is_seq(node))",0x25);
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            trap_instruction();
          }
          pCVar7 = Tree::callbacks(in_RDI->m_tree);
          p_Var10 = pCVar7->m_error;
          in_stack_fffffffffffffb88 = (Tree *)local_3e8;
          Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             (size_t)in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38,
                             (size_t)in_stack_fffffffffffffb30);
          pCVar7 = Tree::callbacks(in_RDI->m_tree);
          in_stack_fffffffffffffb28 = (undefined7)local_410;
          in_stack_fffffffffffffb2f = (char)((ulong)local_410 >> 0x38);
          LVar2.super_LineCol.line = (size_t)pTStack_408;
          LVar2.super_LineCol.offset = local_410;
          LVar2.super_LineCol.col = local_400;
          LVar2.name.str = (char *)uStack_3f8;
          LVar2.name.len = local_3f0;
          (*p_Var10)((char *)in_stack_fffffffffffffb88,0x25,LVar2,pCVar7->m_user_data);
          in_stack_fffffffffffffb30 = pTStack_408;
        }
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
      }
      else {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
      }
    }
  }
  else {
    _write_doc(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    bVar3 = Tree::has_children(in_stack_fffffffffffffb30,
                               CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    if (!bVar3) {
      return;
    }
  }
  local_418 = Tree::first_child(in_stack_fffffffffffffb30,
                                CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
  local_420 = 0;
  while (local_418 != 0xffffffffffffffff) {
    if (local_420 != 0) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
    }
    local_48 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    if (((local_48->m_type).type & KEYVAL) == KEYVAL) {
      local_248 = local_418;
      local_250 = in_RDX;
      pNVar8 = Tree::keysc(in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
      pNVar5 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      local_10 = (void *)((pNVar5->m_type).type & (_WIP_KEY_STYLE|KEYQUO|KEYANCH|KEYREF|KEY));
      local_8 = local_258;
      _write(in_RDI,(int)pNVar8,local_10,local_250);
      WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
                ((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffb30,
                 (char (*) [3])CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
      local_1e8 = local_418;
      in_stack_fffffffffffffb78 = in_RDI;
      local_1f0 = in_RDX;
      in_stack_fffffffffffffb80 =
           (Tree *)Tree::valsc(in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
      pNVar5 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      local_40 = (void *)((pNVar5->m_type).type & (_WIP_VAL_STYLE|VALQUO|VALANCH|VALREF|VAL));
      local_38 = local_1f8;
      _write(in_stack_fffffffffffffb78,(int)in_stack_fffffffffffffb80,local_40,local_1f0);
    }
    else {
      local_50 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
      if (((local_50->m_type).type & KEYVAL) == VAL) {
        local_208 = local_418;
        local_210 = in_RDX;
        pNVar8 = Tree::valsc(in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
        pNVar5 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
        local_30 = (void *)((pNVar5->m_type).type & (_WIP_VAL_STYLE|VALQUO|VALANCH|VALREF|VAL));
        local_28 = local_218;
        _write(in_RDI,(int)pNVar8,local_30,local_210);
      }
      else {
        _do_visit_flow_sl(in_RSI,in_RDX,(size_t)in_stack_fffffffffffffd00);
      }
    }
    local_418 = Tree::next_sibling(in_stack_fffffffffffffb30,
                                   CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    local_420 = local_420 + 1;
  }
  local_188 = in_RDI->m_tree;
  local_68 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  if (((local_68->m_type).type & MAP) == NOTYPE) {
    local_1b8 = in_RDI->m_tree;
    local_150 = Tree::_p(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    if (((local_150->m_type).type & SEQ) != NOTYPE) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
    }
  }
  else {
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
  }
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_flow_sl(size_t node, size_t ilevel)
{
    RYML_ASSERT(!m_tree->is_stream(node));
    RYML_ASSERT(m_tree->is_container(node) || m_tree->is_doc(node));
    RYML_ASSERT(m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node)));

    if(m_tree->is_doc(node))
    {
        _write_doc(node);
        if(!m_tree->has_children(node))
            return;
    }
    else if(m_tree->is_container(node))
    {
        RYML_ASSERT(m_tree->is_map(node) || m_tree->is_seq(node));

        bool spc = false; // write a space

        if(m_tree->has_key(node))
        {
            _writek(node, ilevel);
            this->Writer::_do_write(':');
            spc = true;
        }

        if(m_tree->has_val_tag(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(node));
            spc = true;
        }

        if(m_tree->has_val_anchor(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(node));
            spc = true;
        }

        if(spc)
            this->Writer::_do_write(' ');

        if(m_tree->is_map(node))
        {
            this->Writer::_do_write('{');
        }
        else
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_seq(node));
            this->Writer::_do_write('[');
        }
    } // container

    for(size_t child = m_tree->first_child(node), count = 0; child != NONE; child = m_tree->next_sibling(child))
    {
        if(count++)
            this->Writer::_do_write(',');
        if(m_tree->is_keyval(child))
        {
            _writek(child, ilevel);
            this->Writer::_do_write(": ");
            _writev(child, ilevel);
        }
        else if(m_tree->is_val(child))
        {
            _writev(child, ilevel);
        }
        else
        {
            // with single-line flow, we can never go back to block
            _do_visit_flow_sl(child, ilevel + 1);
        }
    }

    if(m_tree->is_map(node))
    {
        this->Writer::_do_write('}');
    }
    else if(m_tree->is_seq(node))
    {
        this->Writer::_do_write(']');
    }
}